

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays_test_generated.h
# Opt level: O3

void __thiscall
MyGame::Example::ArrayStruct::ArrayStruct
          (ArrayStruct *this,float _a,span<const_int,_15UL> *_b,int8_t _c,
          span<const_MyGame::Example::NestedStruct,_2UL> *_d,int32_t _e,span<const_long,_2UL> *_f)

{
  span<const_long,_2UL> local_50;
  span<const_MyGame::Example::NestedStruct,_2UL> local_40;
  span<const_int,_15UL> local_30;
  
  this->a_ = _a;
  this->c_ = _c;
  *(undefined8 *)&this->padding0__ = 0;
  *(undefined8 *)((long)this->d_[0].a_ + 1) = 0;
  *(undefined8 *)this->d_[0].c_ = 0;
  *(undefined8 *)((long)this->d_[0].d_ + 1) = 0;
  *(undefined8 *)((long)this->d_[0].d_ + 9) = 0;
  *(undefined8 *)((long)this->d_[1].a_ + 1) = 0;
  *(undefined8 *)this->d_[1].c_ = 0;
  *(undefined8 *)((long)this->d_[1].d_ + 1) = 0;
  this->d_[1].d_[1] = 0;
  this->e_ = _e;
  this->padding3__ = 0;
  local_30.data_ = _b->data_;
  local_30.count_ = _b->count_;
  flatbuffers::Array<int,_(unsigned_short)15>::CopyFromSpan
            ((Array<int,_(unsigned_short)15> *)this->b_,&local_30);
  local_40.data_ = _d->data_;
  local_40.count_ = _d->count_;
  flatbuffers::Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::CopyFromSpan
            ((Array<MyGame::Example::NestedStruct,_(unsigned_short)2> *)this->d_,&local_40);
  local_50.data_ = _f->data_;
  local_50.count_ = _f->count_;
  flatbuffers::Array<long,_(unsigned_short)2>::CopyFromSpan
            ((Array<long,_(unsigned_short)2> *)this->f_,&local_50);
  return;
}

Assistant:

ArrayStruct(float _a, ::flatbuffers::span<const int32_t, 15> _b, int8_t _c, ::flatbuffers::span<const MyGame::Example::NestedStruct, 2> _d, int32_t _e, ::flatbuffers::span<const int64_t, 2> _f)
      : a_(::flatbuffers::EndianScalar(_a)),
        c_(::flatbuffers::EndianScalar(_c)),
        padding0__(0),
        padding1__(0),
        padding2__(0),
        e_(::flatbuffers::EndianScalar(_e)),
        padding3__(0) {
    ::flatbuffers::CastToArray(b_).CopyFromSpan(_b);
    (void)padding0__;
    (void)padding1__;
    (void)padding2__;
    ::flatbuffers::CastToArray(d_).CopyFromSpan(_d);
    (void)padding3__;
    ::flatbuffers::CastToArray(f_).CopyFromSpan(_f);
  }